

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O0

Option<Kernel::PolyNf> *
Inferences::trySimplifyUnaryMinus<Kernel::NumTraits<Kernel::IntegerConstantType>>(PolyNf *evalArgs)

{
  uint uVar1;
  Option<Kernel::PolyNf> *in_RDI;
  uint i;
  Polynom out;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffef0;
  Monom *in_stack_fffffffffffffef8;
  Monom *in_stack_ffffffffffffff00;
  Monom *in_stack_ffffffffffffff08;
  uint uVar2;
  Option<Kernel::PolyNf> *this;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff28;
  PolyNf *in_stack_ffffffffffffff58;
  uint local_44;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_40 [4];
  
  this = in_RDI;
  Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>
            (in_stack_ffffffffffffff58);
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  ::operator*(local_40);
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
            (in_stack_fffffffffffffef0,
             (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_44 = 0;
  while( true ) {
    uVar2 = local_44;
    uVar1 = Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::nSummands
                      ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80b6c9);
    if (uVar1 <= uVar2) break;
    in_stack_ffffffffffffff00 =
         Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::summandAt
                   (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    in_stack_ffffffffffffff08 = in_stack_ffffffffffffff00;
    Kernel::IntegerConstantType::IntegerConstantType
              (&in_stack_ffffffffffffff00->numeral,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    Kernel::IntegerConstantType::operator*
              ((IntegerConstantType *)this,(IntegerConstantType *)CONCAT44(uVar1,uVar2));
    in_stack_fffffffffffffef8 =
         Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::summandAt
                   (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    Kernel::IntegerConstantType::operator=
              ((IntegerConstantType *)in_stack_fffffffffffffef0,
               (IntegerConstantType *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
    ;
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80b770);
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80b77d);
    local_44 = local_44 + 1;
  }
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&stack0xffffffffffffff28,
             (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffff28);
  Kernel::AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>
            ((AnyPoly *)in_stack_ffffffffffffff00,
             (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
              *)in_stack_fffffffffffffef8);
  Kernel::PolyNf::PolyNf((PolyNf *)CONCAT44(uVar1,uVar2),(AnyPoly *)in_stack_ffffffffffffff08);
  Lib::some<Kernel::PolyNf>((PolyNf *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
  ;
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80b860);
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80b86d);
  return in_RDI;
}

Assistant:

Option<PolyNf> trySimplifyUnaryMinus(PolyNf* evalArgs)
{
  using Numeral = typename Number::ConstantType;
  using Polynom = Polynom<Number>;

  auto out = Polynom(*evalArgs[0].template wrapPoly<Number>());

  for (unsigned i = 0; i < out.nSummands(); i++) {
     out.summandAt(i).numeral = out.summandAt(i).numeral * Numeral(-1);
  }

  return some<PolyNf>(PolyNf(AnyPoly(perfect(std::move(out)))));
}